

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts
          (deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,ReplaceDescArrayAccessUsingVarIndex *this,Instruction *user)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  pointer pOVar3;
  uint **ppuVar4;
  Instruction *pIVar5;
  bool bVar6;
  char cVar7;
  uint **ppuVar8;
  Operand *operand_1;
  pointer pOVar9;
  Operand *operand;
  Instruction *inst_from_work_list;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_inst_ids;
  undefined8 **local_118;
  undefined8 local_110;
  code *local_108;
  code *local_100;
  Instruction *local_f8;
  uint *local_f0;
  ReplaceDescArrayAccessUsingVarIndex *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  code *local_d0;
  code *local_c8;
  Instruction *local_c0;
  _Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_b8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_e8 = this;
  local_c0 = user;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map(&local_b8,0);
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map(&__return_storage_ptr__->
                     super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ,0);
  ppIVar2 = (__return_storage_ptr__->
            super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppIVar2 ==
      (__return_storage_ptr__->
      super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      )._M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    _M_push_front_aux<spvtools::opt::Instruction*const&>
              ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               __return_storage_ptr__,&local_c0);
    user = local_c0;
  }
  else {
    ppIVar2[-1] = user;
    piVar1 = &(__return_storage_ptr__->
              super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              )._M_impl.super__Deque_impl_data._M_start;
    piVar1->_M_cur = piVar1->_M_cur + -1;
  }
  local_d8 = 0;
  local_e0 = (undefined8 *)operator_new(0x18);
  *local_e0 = local_e8;
  local_e0[1] = &local_68;
  local_e0[2] = &local_b8;
  local_c8 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:128:38)>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:128:38)>
             ::_M_manager;
  local_110 = 0;
  local_100 = std::
              _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
              ::_M_manager;
  pOVar9 = (user->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (user->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_118 = &local_e0;
  if (pOVar9 != pOVar3) {
    do {
      bVar6 = spvIsInIdType(pOVar9->type);
      if (bVar6) {
        ppuVar4 = (uint **)(pOVar9->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar8 = &(pOVar9->words).small_data_;
        if (ppuVar4 != (uint **)0x0) {
          ppuVar8 = ppuVar4;
        }
        local_f0 = *ppuVar8;
        if (local_108 == (code *)0x0) {
LAB_0018f7ef:
          std::__throw_bad_function_call();
        }
        cVar7 = (*local_100)(&local_118,&local_f0);
        if (cVar7 == '\0') break;
      }
      pOVar9 = pOVar9 + 1;
    } while (pOVar9 != pOVar3);
    if (local_108 == (code *)0x0) goto LAB_0018f5f6;
  }
  (*local_108)(&local_118,&local_118,3);
LAB_0018f5f6:
  if (local_d0 != (code *)0x0) {
    (*local_d0)(&local_e0,&local_e0,3);
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_f8 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      ppIVar2 = (__return_storage_ptr__->
                super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (ppIVar2 ==
          (__return_storage_ptr__->
          super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          )._M_impl.super__Deque_impl_data._M_start._M_first) {
        std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        _M_push_front_aux<spvtools::opt::Instruction*const&>
                  ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *
                   )__return_storage_ptr__,&local_f8);
      }
      else {
        ppIVar2[-1] = local_f8;
        piVar1 = &(__return_storage_ptr__->
                  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Deque_impl_data._M_start;
        piVar1->_M_cur = piVar1->_M_cur + -1;
      }
      pIVar5 = local_f8;
      local_d8 = 0;
      local_e0 = (undefined8 *)operator_new(0x18);
      *local_e0 = local_e8;
      local_e0[1] = &local_68;
      local_e0[2] = &local_b8;
      local_c8 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:128:38)>
                 ::_M_invoke;
      local_d0 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:128:38)>
                 ::_M_manager;
      local_110 = 0;
      local_118 = &local_e0;
      local_100 = std::
                  _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                  ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                  ::_M_manager;
      pOVar9 = (pIVar5->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (pIVar5->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar9 == pOVar3) {
LAB_0018f78a:
        (*local_108)(&local_118,&local_118,3);
      }
      else {
        do {
          bVar6 = spvIsInIdType(pOVar9->type);
          if (bVar6) {
            ppuVar4 = (uint **)(pOVar9->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar8 = &(pOVar9->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar8 = ppuVar4;
            }
            local_f0 = *ppuVar8;
            if (local_108 == (code *)0x0) goto LAB_0018f7ef;
            cVar7 = (*local_100)(&local_118,&local_f0);
            if (cVar7 == '\0') break;
          }
          pOVar9 = pOVar9 + 1;
        } while (pOVar9 != pOVar3);
        if (local_108 != (code *)0x0) goto LAB_0018f78a;
      }
      if (local_d0 != (code *)0x0) {
        (*local_d0)(&local_e0,&local_e0,3);
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base(&local_b8);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::deque<Instruction*>
ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(
    Instruction* user) const {
  std::unordered_set<uint32_t> seen_inst_ids;
  std::queue<Instruction*> work_list;

  auto decision_to_include_operand = [this, &seen_inst_ids,
                                      &work_list](uint32_t* idp) {
    if (!seen_inst_ids.insert(*idp).second) return;
    Instruction* operand = get_def_use_mgr()->GetDef(*idp);
    if (context()->get_instr_block(operand) != nullptr &&
        (HasImageOrImagePtrType(operand) ||
         operand->opcode() == spv::Op::OpAccessChain ||
         operand->opcode() == spv::Op::OpInBoundsAccessChain)) {
      work_list.push(operand);
    }
  };

  std::deque<Instruction*> required_insts;
  required_insts.push_front(user);
  user->ForEachInId(decision_to_include_operand);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    required_insts.push_front(inst_from_work_list);
    inst_from_work_list->ForEachInId(decision_to_include_operand);
  }
  return required_insts;
}